

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManTestSat(Sbl_Man_t *p,int iPivot)

{
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  lit *plVar5;
  ulong uVar6;
  ulong uVar7;
  ABC_INT64_T AVar8;
  ABC_INT64_T AVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  uint *puVar15;
  abctime *paVar16;
  Vec_Int_t *pVVar17;
  abctime aVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar23;
  char *__format;
  Sbl_Man_t *p_00;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  timespec ts;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar27;
  timespec local_a0;
  uint local_90;
  uint local_8c;
  uint local_88;
  int local_84;
  uint local_80;
  int local_7c;
  long local_78;
  uint local_6c;
  int local_68;
  int local_64;
  Sbl_Man_t *local_60;
  abctime *local_58;
  abctime *local_50;
  abctime *local_48;
  long local_40;
  ulong local_38;
  ulong uVar22;
  
  iVar10 = clock_gettime(3,&local_a0);
  if (iVar10 < 0) {
    lVar20 = 1;
  }
  else {
    lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
    lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_a0.tv_sec * -1000000;
  }
  iVar10 = p->pHash->vMap->nSize;
  p->nTried = p->nTried + 1;
  Sbl_ManClean(p);
  iVar11 = Sbl_ManWindow2(p,iPivot);
  if (iVar11 == 0) {
    if (p->fVeryVerbose != 0) {
      printf("Obj %d: Window with less than %d nodes does not exist.\n",iPivot,(ulong)(uint)p->nVars
            );
    }
    p->nSmallWins = p->nSmallWins + 1;
    return 0;
  }
  pVVar17 = p->vAnds;
  pHVar1 = p->pHash;
  pVVar2 = pHVar1->vTable;
  local_90 = iPivot;
  local_60 = p;
  local_40 = lVar20;
  if (pVVar2->nSize < pHVar1->vMap->nSize) {
    uVar23 = (ulong)(pVVar2->nSize * 2 - 1);
    while( true ) {
      do {
        uVar19 = (uint)uVar23;
        uVar21 = uVar19 + 1;
        uVar22 = (ulong)uVar21;
        uVar6 = uVar23 & 1;
        uVar23 = uVar22;
      } while (uVar6 != 0);
      if (uVar21 < 9) break;
      iVar11 = 5;
      while (uVar21 % (iVar11 - 2U) != 0) {
        uVar12 = iVar11 * iVar11;
        iVar11 = iVar11 + 2;
        if (uVar21 < uVar12) goto LAB_0074f01c;
      }
    }
LAB_0074f01c:
    if (pVVar2->nCap < (int)uVar21) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar14 = (int *)malloc((long)(int)uVar21 << 2);
      }
      else {
        piVar14 = (int *)realloc(pVVar2->pArray,(long)(int)uVar21 << 2);
      }
      pVVar2->pArray = piVar14;
      if (piVar14 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = uVar21;
    }
    if (uVar19 < 0x7fffffff) {
      memset(pVVar2->pArray,0xff,uVar22 << 2);
    }
    pVVar2->nSize = uVar21;
    pVVar2 = pHVar1->vMap;
    if (0 < pVVar2->nSize) {
      pVVar3 = pHVar1->vTable;
      pVVar4 = pHVar1->vData;
      lVar20 = 0;
      do {
        iVar11 = pVVar2->pArray[lVar20];
        if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) goto LAB_0074fe96;
        piVar14 = pVVar4->pArray + iVar11;
        iVar11 = *piVar14;
        (pHVar1->vTemp).nCap = iVar11;
        (pHVar1->vTemp).nSize = iVar11;
        (pHVar1->vTemp).pArray = piVar14 + 2;
        if ((long)iVar11 < 1) {
          uVar19 = 0;
        }
        else {
          uVar23 = 0;
          uVar19 = 0;
          do {
            uVar19 = uVar19 + (&Hsh_VecManHash_s_Primes)[uVar23 % 7] * (piVar14 + 2)[uVar23];
            uVar23 = uVar23 + 1;
          } while ((long)iVar11 != uVar23);
        }
        uVar21 = pVVar3->nSize;
        uVar23 = (ulong)uVar19 % (ulong)uVar21;
        if (((int)uVar23 < 0) || ((int)uVar21 <= (int)uVar23)) goto LAB_0074fe96;
        if (pVVar2->nSize <= lVar20) goto LAB_0074feb5;
        iVar11 = pVVar2->pArray[lVar20];
        if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) goto LAB_0074fe96;
        piVar14 = pVVar3->pArray;
        pVVar4->pArray[(long)iVar11 + 1] = piVar14[uVar23];
        piVar14[uVar23] = (int)lVar20;
        lVar20 = lVar20 + 1;
      } while (lVar20 < pVVar2->nSize);
    }
  }
  uVar19 = pHVar1->vTable->nSize;
  iVar11 = pVVar17->nSize;
  if ((long)iVar11 < 1) {
    uVar21 = 0;
  }
  else {
    uVar23 = 0;
    uVar21 = 0;
    do {
      uVar21 = uVar21 + (&Hsh_VecManHash_s_Primes)[uVar23 % 7] * pVVar17->pArray[uVar23];
      uVar23 = uVar23 + 1;
    } while ((long)iVar11 != uVar23);
  }
  uVar23 = (ulong)uVar21 % (ulong)uVar19;
  iVar13 = (int)uVar23;
  if ((iVar13 < 0) || ((int)uVar19 <= iVar13)) {
LAB_0074fe96:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar15 = (uint *)(pHVar1->vTable->pArray + uVar23);
  while( true ) {
    uVar19 = *puVar15;
    if ((ulong)uVar19 == 0xffffffff) {
      piVar14 = (int *)0x0;
    }
    else {
      if (((int)uVar19 < 0) || (pHVar1->vMap->nSize <= (int)uVar19)) goto LAB_0074feb5;
      iVar13 = pHVar1->vMap->pArray[uVar19];
      if (((long)iVar13 < 0) || (pHVar1->vData->nSize <= iVar13)) goto LAB_0074fe96;
      piVar14 = pHVar1->vData->pArray + iVar13;
    }
    if (piVar14 == (int *)0x0) break;
    if ((*piVar14 == iVar11) &&
       (iVar13 = bcmp(piVar14 + 2,pVVar17->pArray,(long)*piVar14 << 2), iVar13 == 0))
    goto LAB_0074f303;
    puVar15 = (uint *)(piVar14 + 1);
  }
  pVVar2 = pHVar1->vMap;
  *puVar15 = pVVar2->nSize;
  uVar19 = pHVar1->vData->nSize;
  if ((uVar19 & 1) != 0) {
    __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecHsh.h"
                  ,0x17a,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
  }
  Vec_IntPush(pVVar2,uVar19);
  Vec_IntPush(pHVar1->vData,pVVar17->nSize);
  Vec_IntPush(pHVar1->vData,-1);
  uVar23 = (ulong)(uint)pVVar17->nSize;
  if (0 < pVVar17->nSize) {
    lVar20 = 0;
    do {
      Vec_IntPush(pHVar1->vData,pVVar17->pArray[lVar20]);
      lVar20 = lVar20 + 1;
      uVar23 = (ulong)pVVar17->nSize;
    } while (lVar20 < (long)uVar23);
  }
  if ((uVar23 & 1) != 0) {
    Vec_IntPush(pHVar1->vData,-1);
  }
LAB_0074f303:
  p_00 = local_60;
  if (iVar10 == local_60->pHash->vMap->nSize) {
    if (local_60->fVeryVerbose != 0) {
      printf("Obj %d: This window was already tried.\n",(ulong)local_90);
    }
    p_00->nHashWins = p_00->nHashWins + 1;
    return 0;
  }
  if (local_60->fVeryVerbose != 0) {
    printf("\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n",(ulong)local_90,
           (ulong)(uint)local_60->vLeaves->nSize,(ulong)(uint)local_60->vAnds->nSize);
  }
  uVar19 = p_00->vLeaves->nSize;
  if ((0x80 < (int)uVar19) || (iVar10 = p_00->vAnds->nSize, p_00->nVars < iVar10)) {
    if (p_00->fVeryVerbose != 0) {
      printf("Obj %d: Encountered window with %d inputs and %d internal nodes.\n",(ulong)local_90,
             (ulong)uVar19,(ulong)(uint)p_00->vAnds->nSize);
    }
    p_00->nLargeWins = p_00->nLargeWins + 1;
    return 0;
  }
  if (iVar10 < 10) {
    if (p_00->fVeryVerbose != 0) {
      puts("Skipping.");
      return 0;
    }
    return 0;
  }
  Sbl_ManComputeCuts(p_00);
  Sbl_ManCreateCnf(p_00);
  if (p_00->fVeryVeryVerbose != 0) {
    uVar21 = sat_solver_nclauses(p_00->pSat);
    uVar19 = p_00->vAnds->nSize;
    iVar10 = p_00->vCutsI1->nSize;
    sat_solver_nclauses(p_00->pSat);
    printf("All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n",
           (ulong)uVar21,(ulong)uVar19,(ulong)(iVar10 - uVar19));
  }
  pVVar17 = p_00->vAssump;
  pVVar17->nSize = 0;
  Vec_IntPush(pVVar17,-1);
  iVar10 = p_00->vAnds->nSize;
  if (iVar10 < p_00->Power2) {
    iVar11 = iVar10 * 2 + 1;
    iVar13 = iVar10;
    do {
      if (iVar10 < 0) goto LAB_0074fef3;
      Vec_IntPush(p_00->vAssump,iVar11);
      iVar13 = iVar13 + 1;
      iVar11 = iVar11 + 2;
    } while (iVar13 < p_00->Power2);
  }
  pVVar17 = p_00->vRootVars;
  if (0 < pVVar17->nSize) {
    lVar20 = 0;
    do {
      if (pVVar17->pArray[lVar20] < 0) goto LAB_0074fef3;
      Vec_IntPush(p_00->vAssump,pVVar17->pArray[lVar20] * 2);
      lVar20 = lVar20 + 1;
      pVVar17 = p_00->vRootVars;
    } while (lVar20 < pVVar17->nSize);
  }
  local_68 = p_00->vSolInit->nSize + 1;
  local_50 = &p_00->timeSatUnd;
  local_58 = &p_00->timeSatUns;
  local_48 = &p_00->timeSatSat;
  iVar10 = 1;
  local_80 = 0;
  local_88 = 0;
  do {
    uVar27 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if ((iVar10 == 0) || (uVar19 = local_68 - iVar10, (int)uVar19 < 1)) break;
    local_84 = iVar10;
    if (p_00->fVeryVerbose != 0) {
      printf("Trying to find mapping with %d LUTs.\n",(ulong)uVar19);
    }
    if (((int)uVar19 < 0) || (p_00->vCardVars->nSize <= (int)uVar19)) {
LAB_0074feb5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar10 = p_00->vCardVars->pArray[uVar19];
    if (iVar10 < 0) {
LAB_0074fef3:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    if (p_00->vAssump->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *p_00->vAssump->pArray = iVar10 * 2 + 1;
    iVar10 = clock_gettime(3,&local_a0);
    lVar20 = -1;
    local_78 = -1;
    if (-1 < iVar10) {
      local_78 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
    }
    AVar8 = (p_00->pSat->stats).conflicts;
    plVar5 = p_00->vAssump->pArray;
    in_stack_ffffffffffffff58 = 0;
    iVar11 = sat_solver_solve(p_00->pSat,plVar5,plVar5 + p_00->vAssump->nSize,(long)p_00->nBTLimit,0
                              ,0,0);
    iVar10 = clock_gettime(3,&local_a0);
    if (-1 < iVar10) {
      lVar20 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
    }
    p_00->timeSat = p_00->timeSat + (lVar20 - local_78);
    AVar9 = (p_00->pSat->stats).conflicts;
    p_00->nRuns = p_00->nRuns + 1;
    if (iVar11 == 1) {
      iVar10 = clock_gettime(3,&local_a0);
      paVar16 = local_48;
      if (iVar10 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
    }
    else if (iVar11 == -1) {
      iVar10 = clock_gettime(3,&local_a0);
      paVar16 = local_58;
      if (iVar10 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
    }
    else {
      iVar10 = clock_gettime(3,&local_a0);
      paVar16 = local_50;
      if (iVar10 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
    }
    uVar19 = (int)AVar9 - (int)AVar8;
    *paVar16 = *paVar16 + (lVar20 - local_78);
    local_88 = local_88 + uVar19;
    local_80 = local_80 + 1;
    bVar26 = false;
    iVar10 = local_84;
    if (iVar11 != 0) {
      local_7c = iVar11;
      local_6c = uVar19;
      if (iVar11 == 1) {
        local_8c = 0;
        if (p_00->fVeryVeryVerbose != 0) {
          if (0 < p_00->vAnds->nSize) {
            iVar10 = 0;
            do {
              uVar19 = sat_solver_var_value(p_00->pSat,iVar10);
              printf("%d",(ulong)uVar19);
              iVar10 = iVar10 + 1;
            } while (iVar10 < p_00->vAnds->nSize);
          }
          putchar(10);
          if (p_00->vAnds->nSize < 1) {
            uVar19 = 0;
          }
          else {
            uVar23 = 0;
            uVar19 = 0;
            do {
              iVar13 = (int)uVar23;
              iVar10 = sat_solver_var_value(p_00->pSat,iVar13);
              if (iVar10 != 0) {
                uVar21 = sat_solver_var_value(p_00->pSat,iVar13);
                printf("%d=%d ",uVar23,(ulong)uVar21);
                uVar19 = uVar19 + 1;
              }
              uVar23 = (ulong)(iVar13 + 1U);
            } while ((int)(iVar13 + 1U) < p_00->vAnds->nSize);
          }
          printf("Count = %d\n",(ulong)uVar19);
        }
        p_00->vSolCur->nSize = 0;
        iVar10 = p_00->FirstVar;
        iVar13 = sat_solver_nvars(p_00->pSat);
        if (iVar10 < iVar13) {
          uVar23 = 1;
          local_8c = 0;
          do {
            iVar13 = sat_solver_var_value(p_00->pSat,iVar10);
            if (iVar13 != 0) {
              if (p_00->fVeryVeryVerbose != 0) {
                uVar19 = iVar10 - p_00->FirstVar;
                if (((int)uVar19 < 0) || (p_00->vCutsObj->nSize <= (int)uVar19)) goto LAB_0074feb5;
                iVar13 = p_00->vCutsObj->pArray[uVar19];
                lVar20 = (long)iVar13;
                if ((lVar20 < 0) || (p_00->vAnds->nSize <= iVar13)) goto LAB_0074feb5;
                printf("Cut %3d : Node = %3d %6d  ",uVar23 & 0xffffffff,lVar20,
                       (ulong)(uint)p_00->vAnds->pArray[lVar20]);
                uVar23 = (ulong)((int)uVar23 + 1);
              }
              if (p_00->fVeryVeryVerbose != 0) {
                uVar19 = iVar10 - p_00->FirstVar;
                if (((((int)uVar19 < 0) || (p_00->vCutsI1->nSize <= (int)uVar19)) ||
                    (p_00->vCutsI2->nSize <= (int)uVar19)) ||
                   ((p_00->vCutsN1->nSize <= (int)uVar19 ||
                    (local_64 = iVar10, local_38 = uVar23, p_00->vCutsN2->nSize <= (int)uVar19)))) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                                ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
                }
                uVar23 = p_00->vCutsI1->pArray[uVar19];
                uVar6 = p_00->vCutsI2->pArray[uVar19];
                uVar22 = p_00->vCutsN1->pArray[uVar19];
                uVar7 = p_00->vCutsN2->pArray[uVar19];
                uVar24 = 0;
                printf("{ ");
                iVar10 = 0;
                do {
                  if ((uVar23 >> (uVar24 & 0x3f) & 1) != 0) {
                    printf("i%d ",uVar24 & 0xffffffff);
                    iVar10 = iVar10 + 1;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != 0x40);
                uVar23 = 0;
                do {
                  if ((uVar6 >> (uVar23 & 0x3f) & 1) != 0) {
                    printf("i%d ",(ulong)((uint)uVar23 | 0x40));
                    iVar10 = iVar10 + 1;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != 0x40);
                putchar(0x20);
                uVar23 = 0;
                do {
                  if ((uVar22 >> (uVar23 & 0x3f) & 1) != 0) {
                    printf("n%d ",uVar23 & 0xffffffff);
                    iVar10 = iVar10 + 1;
                  }
                  iVar11 = local_7c;
                  uVar23 = uVar23 + 1;
                } while (uVar23 != 0x40);
                uVar23 = 0;
                do {
                  if ((uVar7 >> (uVar23 & 0x3f) & 1) != 0) {
                    printf("n%d ",(ulong)((uint)uVar23 | 0x40));
                    iVar10 = iVar10 + 1;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != 0x40);
                puts("};");
                local_8c = local_8c + iVar10;
                p_00 = local_60;
                uVar23 = local_38;
                iVar10 = local_64;
              }
              Vec_IntPush(p_00->vSolCur,iVar10 - p_00->FirstVar);
            }
            iVar10 = iVar10 + 1;
            iVar13 = sat_solver_nvars(p_00->pSat);
          } while (iVar10 < iVar13);
        }
      }
      else {
        local_8c = 0;
      }
      iVar10 = 0;
      if (iVar11 == 1) {
        if ((p_00->fDelay == 0) ||
           (iVar10 = Sbl_ManEvaluateMapping(p_00,p_00->DelayMax), iVar10 != 0)) {
          pVVar17 = p_00->vSolBest;
          pVVar17->nSize = 0;
          pVVar2 = p_00->vSolCur;
          if (0 < pVVar2->nSize) {
            lVar20 = 0;
            do {
              Vec_IntPush(pVVar17,pVVar2->pArray[lVar20]);
              lVar20 = lVar20 + 1;
            } while (lVar20 < pVVar2->nSize);
          }
          iVar11 = local_7c;
          iVar10 = local_84 + 1;
        }
        else {
          if (p_00->fVeryVerbose != 0) {
            printf("Critical path of length (%d) is detected:   ",(ulong)(uint)p_00->vPath->nSize);
            pVVar17 = p_00->vPath;
            if (0 < pVVar17->nSize) {
              uVar23 = 0;
              do {
                if (pVVar17->pArray[uVar23] < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                uVar19 = (uint)pVVar17->pArray[uVar23] >> 1;
                if (p_00->vAnds->nSize <= (int)uVar19) goto LAB_0074feb5;
                printf("%d=%d ",uVar23 & 0xffffffff,(ulong)(uint)p_00->vAnds->pArray[uVar19]);
                uVar23 = uVar23 + 1;
                pVVar17 = p_00->vPath;
              } while ((long)uVar23 < (long)pVVar17->nSize);
            }
            putchar(10);
          }
          plVar5 = p_00->vPath->pArray;
          iVar13 = sat_solver_addclause(p_00->pSat,plVar5,plVar5 + p_00->vPath->nSize);
          iVar10 = local_84;
          if (iVar13 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                          ,0x452,"int Sbl_ManTestSat(Sbl_Man_t *, int)");
          }
        }
      }
      if (p_00->fVeryVerbose != 0) {
        __format = "UNDEC ";
        if (iVar11 == 1) {
          __format = "SAT   ";
        }
        if (iVar11 == -1) {
          __format = "UNSAT ";
        }
        printf(__format);
        printf("confl =%8d.    ",(ulong)local_6c);
        iVar13 = 3;
        iVar11 = clock_gettime(3,&local_a0);
        lVar20 = -1;
        lVar25 = -1;
        if (-1 < iVar11) {
          lVar25 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
        }
        lVar25 = lVar25 - local_78;
        Abc_Print(iVar13,"%s =","Time");
        Abc_Print(iVar13,"%9.2f sec\n",(double)lVar25 / 1000000.0);
        printf("Total ");
        printf("confl =%8d.    ",(ulong)local_88);
        iVar13 = 3;
        iVar11 = clock_gettime(3,&local_a0);
        if (-1 < iVar11) {
          lVar20 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
        }
        lVar20 = lVar20 + local_40;
        Abc_Print(iVar13,"%s =","Time");
        Abc_Print(iVar13,"%9.2f sec\n",(double)lVar20 / 1000000.0);
        if ((local_7c == 1) && (p_00->fVeryVeryVerbose != 0)) {
          printf("LitCount = %d.\n",(ulong)local_8c);
        }
        putchar(10);
      }
      bVar26 = local_80 != 10;
      if (!bVar26) {
        p_00->nIterOuts = p_00->nIterOuts + 1;
      }
    }
    uVar27 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  } while (bVar26);
  iVar10 = p_00->vSolBest->nSize;
  if ((0 < iVar10) && (iVar10 < p_00->vSolInit->nSize)) {
    Sbl_ManUpdateMapping(p_00);
    if (p_00->pGia->vEdge1 == (Vec_Int_t *)0x0) {
      uVar19 = Sbl_ManCreateTiming(p_00,p_00->DelayMax);
      iVar10 = 0;
    }
    else {
      uVar19 = Gia_ManEvalEdgeDelay(p_00->pGia);
      iVar10 = Gia_ManEvalEdgeCount(p_00->pGia);
    }
    if (p_00->fVerbose != 0) {
      printf("Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n",
             (ulong)local_90,(ulong)(uint)(p_00->vSolInit->nSize - p_00->vSolBest->nSize),
             (ulong)local_88,(ulong)local_80,(ulong)uVar19,CONCAT44(uVar27,iVar10));
    }
    aVar18 = Abc_Clock();
    p_00->timeTotal = p_00->timeTotal + (aVar18 - p_00->timeStart);
    p_00->nImproved = p_00->nImproved + 1;
    return 2;
  }
  iVar10 = clock_gettime(3,&local_a0);
  if (iVar10 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
  }
  p_00->timeTotal = p_00->timeTotal + (lVar20 - p_00->timeStart);
  return 1;
}

Assistant:

int Sbl_ManTestSat( Sbl_Man_t * p, int iPivot )
{
    int fKeepTrying = 1;
    abctime clk = Abc_Clock(), clk2;
    int i, status, Root, Count, StartSol, nConfTotal = 0, nIters = 0;
    int nEntries = Hsh_VecSize( p->pHash );
    p->nTried++;

    Sbl_ManClean( p );

    // compute one window
    Count = Sbl_ManWindow2( p, iPivot );
    if ( Count == 0 )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Window with less than %d nodes does not exist.\n", iPivot, p->nVars );
        p->nSmallWins++;
        return 0;
    }
    Hsh_VecManAdd( p->pHash, p->vAnds );
    if ( nEntries == Hsh_VecSize(p->pHash) )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: This window was already tried.\n", iPivot );
        p->nHashWins++;
        return 0;
    }
    if ( p->fVeryVerbose )
    printf( "\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n", 
        iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds), Vec_IntSize(p->vRoots), Vec_IntSize(p->vNodes) ); 

    if ( Vec_IntSize(p->vLeaves) > 128 || Vec_IntSize(p->vAnds) > p->nVars )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Encountered window with %d inputs and %d internal nodes.\n", iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds) );
        p->nLargeWins++;
        return 0;
    }
    if ( Vec_IntSize(p->vAnds) < 10 )
    {
        if ( p->fVeryVerbose )
        printf( "Skipping.\n" );
        return 0;
    }

    // derive cuts
    Sbl_ManComputeCuts( p );
    // derive SAT instance
    Sbl_ManCreateCnf( p );

    if ( p->fVeryVeryVerbose )
    printf( "All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n", 
        sat_solver_nclauses(p->pSat), Vec_IntSize(p->vAnds), Vec_WrdSize(p->vCutsI1) - Vec_IntSize(p->vAnds), 
        sat_solver_nclauses(p->pSat) - Vec_WrdSize(p->vCutsI1) );

    // create assumptions
    // cardinality
    Vec_IntClear( p->vAssump );
    Vec_IntPush( p->vAssump, -1 );
    // unused variables
    for ( i = Vec_IntSize(p->vAnds); i < p->Power2; i++ )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(i, 1) );
    // root variables
    Vec_IntForEachEntry( p->vRootVars, Root, i )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(Root, 0) );
//    Vec_IntPrint( p->vAssump );

    StartSol = Vec_IntSize(p->vSolInit) + 1;
//    StartSol = 30;
    while ( fKeepTrying && StartSol-fKeepTrying > 0 )
    {
        int Count = 0, LitCount = 0;
        int nConfBef, nConfAft;
        if ( p->fVeryVerbose )
            printf( "Trying to find mapping with %d LUTs.\n", StartSol-fKeepTrying );
    //    for ( i = Vec_IntSize(p->vSolInit)-5; i < nVars; i++ )
    //        Vec_IntPush( p->vAssump, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, i), 1) );
        Vec_IntWriteEntry( p->vAssump, 0, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, StartSol-fKeepTrying), 1) );
        // solve the problem
        clk2 = Abc_Clock();
        nConfBef = (int)p->pSat->stats.conflicts;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vAssump), Vec_IntLimit(p->vAssump), p->nBTLimit, 0, 0, 0 );
        p->timeSat += Abc_Clock() - clk2;
        nConfAft = (int)p->pSat->stats.conflicts;
        nConfTotal += nConfAft - nConfBef;
        nIters++;
        p->nRuns++;
        if ( status == l_True )
            p->timeSatSat += Abc_Clock() - clk2;
        else if ( status == l_False )
            p->timeSatUns += Abc_Clock() - clk2;
        else 
            p->timeSatUnd += Abc_Clock() - clk2;
        if ( status == l_Undef )
            break;
        if ( status == l_True )
        {
            if ( p->fVeryVeryVerbose )
            {
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    printf( "%d", sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    if ( sat_solver_var_value(p->pSat, i) )
                    {
                        printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                        Count++;
                    }
                printf( "Count = %d\n", Count );
            }
//            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
//                printf( "%d", sat_solver_var_value(p->pSat, i) );
//            printf( "\n" );
            Count = 1;
            Vec_IntClear( p->vSolCur );
            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                {
                    if ( p->fVeryVeryVerbose )
                        printf( "Cut %3d : Node = %3d %6d  ", Count++, Vec_IntEntry(p->vCutsObj, i-p->FirstVar), Vec_IntEntry(p->vAnds, Vec_IntEntry(p->vCutsObj, i-p->FirstVar)) );
                    if ( p->fVeryVeryVerbose )
                        LitCount += Sbl_ManFindAndPrintCut( p, i-p->FirstVar );
                    Vec_IntPush( p->vSolCur, i-p->FirstVar );
                }
            //Vec_IntPrint( p->vRootVars );
            //Vec_IntPrint( p->vRoots );
            //Vec_IntPrint( p->vAnds );
            //Vec_IntPrint( p->vLeaves );
        }

//        fKeepTrying = status == l_True ? fKeepTrying + 1 : 0;
        // check the timing
        if ( status == l_True )
        {
            if ( p->fDelay && !Sbl_ManEvaluateMapping(p, p->DelayMax) )
            {
                int iLit, value;
                if ( p->fVeryVerbose )
                {
                    printf( "Critical path of length (%d) is detected:   ", Vec_IntSize(p->vPath) );
                    Vec_IntForEachEntry( p->vPath, iLit, i )
                        printf( "%d=%d ", i, Vec_IntEntry(p->vAnds, Abc_Lit2Var(iLit)) );
                    printf( "\n" );
                }
                // add the clause
                value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vPath), Vec_IntLimit(p->vPath)  );
                assert( value );
            }
            else
            {
                Vec_IntClear( p->vSolBest );
                Vec_IntAppend( p->vSolBest, p->vSolCur );
                fKeepTrying++;
            }
        }
        else
            fKeepTrying = 0;
        if ( p->fVeryVerbose )
        {
            if ( status == l_False )
                printf( "UNSAT " );
            else if ( status == l_True )
                printf( "SAT   " );
            else 
                printf( "UNDEC " );
            printf( "confl =%8d.    ", nConfAft - nConfBef );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );

            printf( "Total " );
            printf( "confl =%8d.    ", nConfTotal );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( p->fVeryVeryVerbose && status == l_True )
                printf( "LitCount = %d.\n", LitCount );
            printf( "\n" );
        }
        if ( nIters == 10 )
        {
            p->nIterOuts++;
            //printf( "Obj %d : Quitting after %d iterations.\n", iPivot, nIters );
            break;
        }
    }

    // update solution
    if ( Vec_IntSize(p->vSolBest) > 0 && Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) )
    {
        int nDelayCur, nEdgesCur = 0;
        Sbl_ManUpdateMapping( p );
        if ( p->pGia->vEdge1 )
        {
            nDelayCur = Gia_ManEvalEdgeDelay( p->pGia );
            nEdgesCur = Gia_ManEvalEdgeCount( p->pGia );
        }
        else
            nDelayCur = Sbl_ManCreateTiming( p, p->DelayMax );
        if ( p->fVerbose )
        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n", 
            iPivot, Vec_IntSize(p->vSolInit)-Vec_IntSize(p->vSolBest), nConfTotal, nIters, nDelayCur, nEdgesCur );
        p->timeTotal += Abc_Clock() - p->timeStart;
        p->nImproved++;
        return 2;
    }
    else
    {
//        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d\n", iPivot, 0, nConfTotal, nIters );
    }
    p->timeTotal += Abc_Clock() - p->timeStart;
    return 1;
}